

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_generic_isset_method
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *field;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  t_dart_generator *ptVar5;
  int iVar6;
  ostream *poVar7;
  pointer pptVar8;
  size_type sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  t_struct *local_c8;
  t_dart_generator *local_c0;
  ostream *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_c8 = tstruct;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "// Returns true if field corresponding to fieldID is set (has been assigned a value) and false otherwise"
             ,0x68);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"bool isSet(int fieldID)",0x17);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  scope_up(this,out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"switch (fieldID)",0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," ","");
  scope_up(this,out,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pptVar8 = (local_c8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ptVar5 = this;
  poVar7 = out;
  if (pptVar8 !=
      (local_c8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_b8 = poVar7;
      local_c0 = ptVar5;
      field = *pptVar8;
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"case ",5);
      pcVar2 = (field->name_)._M_dataplus._M_p;
      local_108 = &local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar2,pcVar2 + (field->name_)._M_string_length);
      sVar4 = local_100;
      paVar3 = local_108;
      if (local_100 != 0) {
        sVar9 = 0;
        do {
          iVar6 = toupper((int)paVar3->_M_local_buf[sVar9]);
          paVar3->_M_local_buf[sVar9] = (char)iVar6;
          sVar9 = sVar9 + 1;
        } while (sVar4 != sVar9);
      }
      sVar4 = local_100;
      if (local_108 == &local_f8) {
        local_e8.field_2._8_8_ = local_f8._8_8_;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)local_108;
      }
      local_e8.field_2._M_allocated_capacity._1_7_ = local_f8._M_allocated_capacity._1_7_;
      local_e8.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
      local_e8._M_string_length = local_100;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_108 = &local_f8;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e8._M_dataplus._M_p,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      out = local_b8;
      this = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return ",7);
      generate_isset_check_abi_cxx11_(&local_e8,this,field);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      pptVar8 = pptVar8 + 1;
      ptVar5 = local_c0;
      poVar7 = local_b8;
    } while (pptVar8 !=
             (local_c8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"throw new ArgumentError(\"Field $fieldID doesn\'t exist!\");",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,out,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_generic_isset_method(std::ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // create the isSet method
  indent(out) << "// Returns true if field corresponding to fieldID is set (has been assigned a "
                 "value) and false otherwise" << endl;
  indent(out) << "bool isSet(int fieldID)";
  scope_up(out);

  indent(out) << "switch (fieldID)";
  scope_up(out);

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    indent(out) << "case " << upcase_string(field->get_name()) << ":" << endl;
    indent_up();
    indent(out) << "return " << generate_isset_check(field) << ";" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "throw new ArgumentError(\"Field $fieldID doesn't exist!\");" << endl;
  indent_down();

  scope_down(out);  // switch
  scope_down(out, endl2);  // method
}